

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *name,
          string *comment)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  string *psVar2;
  cmTarget *t;
  cmState *this_01;
  char *value;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_38;
  
  pcVar1 = cmLocalGenerator::FindGeneratorTargetToUse(localGen,name);
  if (pcVar1 == (cmGeneratorTarget *)0x0) {
    this_00 = localGen->Makefile;
    psVar2 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this_00);
    local_78.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    t = cmMakefile::AddUtilityCommand
                  (this_00,name,Generator,true,(psVar2->_M_dataplus)._M_p,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_78,&local_58,(cmCustomCommandLines *)&local_38,false,
                   (comment->_M_dataplus)._M_p,false,false);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    pcVar1 = (cmGeneratorTarget *)operator_new(0x5a8);
    cmGeneratorTarget::cmGeneratorTarget(pcVar1,t,localGen);
    cmLocalGenerator::AddGeneratorTarget(localGen,pcVar1);
    this_01 = cmMakefile::GetState(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"AUTOGEN_TARGETS_FOLDER",(allocator<char> *)&local_58);
    value = cmState::GetGlobalProperty(this_01,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (value != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"FOLDER",(allocator<char> *)&local_58);
      cmTarget::SetProperty(t,&local_78,value);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget(
  cmLocalGenerator* localGen, std::string const& name,
  std::string const& comment)
{
  // Test if the target already exists
  if (localGen->FindGeneratorTargetToUse(name) == nullptr) {
    cmMakefile* makefile = localGen->GetMakefile();

    // Create utility target
    cmTarget* target = makefile->AddUtilityCommand(
      name, cmMakefile::TargetOrigin::Generator, true,
      makefile->GetHomeOutputDirectory().c_str() /*work dir*/,
      std::vector<std::string>() /*output*/,
      std::vector<std::string>() /*depends*/, cmCustomCommandLines(), false,
      comment.c_str());
    localGen->AddGeneratorTarget(new cmGeneratorTarget(target, localGen));

    // Set FOLDER property in the target
    {
      char const* folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      if (folder != nullptr) {
        target->SetProperty("FOLDER", folder);
      }
    }
  }
}